

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_container(lyout *out,lys_node *node,int *first)

{
  char *label;
  char *val;
  lys_module *plVar1;
  lys_node_container *cont;
  int *first_local;
  lys_node *node_local;
  lyout *out_local;
  
  label = node->name;
  val = jsons_nodetype_str(node->nodetype);
  jsons_print_object(out,label,"nodetype",val,0,first);
  plVar1 = lys_main_module(node->module);
  ly_print(out,",\"module\":\"%s\"",plVar1->name);
  if ((*(ushort *)&node->module->field_0x40 & 1) != 0) {
    ly_print(out,",\"included-from\":\"%s\"",node->module->name);
  }
  jsons_print_text(out,"description","text",node->dsc,1,(int *)0x0);
  jsons_print_text(out,"reference","text",node->ref,1,(int *)0x0);
  jsons_print_config(out,node->flags,(int *)0x0);
  jsons_print_status(out,node->flags,(int *)0x0);
  jsons_print_text(out,"presence","value",*(char **)&node[1].flags,1,(int *)0x0);
  jsons_print_iffeatures(out,node->module,node->iffeature,node->iffeature_size,(int *)0x0);
  jsons_print_when(out,(lys_when *)node[1].name,(int *)0x0);
  jsons_print_musts(out,(lys_restr *)node[1].dsc,node->padding[1],(int *)0x0);
  jsons_print_typedefs
            (out,(lys_tpdf *)node[1].ref,(uint8_t)*(undefined2 *)(node->padding + 2),(int *)0x0);
  jsons_print_groupings(out,node->child,(int *)0x0);
  jsons_print_data(out,node->module,node->child,(int *)0x0);
  jsons_print_actions(out,node->child,(int *)0x0);
  jsons_print_notifs(out,node->child,(int *)0x0);
  ly_print(out,"}");
  return;
}

Assistant:

static void
jsons_print_container(struct lyout *out, const struct lys_node *node, int *first)
{
    struct lys_node_container *cont = (struct lys_node_container *)node;

    jsons_print_object(out, node->name, "nodetype", jsons_nodetype_str(node->nodetype), 0, first);
    ly_print(out, ",\"module\":\"%s\"", lys_main_module(node->module)->name);
    if (node->module->type) {
        ly_print(out, ",\"included-from\":\"%s\"", node->module->name);
    }
    jsons_print_text(out, "description", "text", cont->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", cont->ref, 1, NULL);
    jsons_print_config(out, cont->flags, NULL);
    jsons_print_status(out, cont->flags, NULL);
    jsons_print_text(out, "presence", "value", cont->presence, 1, NULL);
    jsons_print_iffeatures(out, cont->module, cont->iffeature, cont->iffeature_size, NULL);
    jsons_print_when(out, cont->when, NULL);
    jsons_print_musts(out, cont->must, cont->must_size, NULL);
    jsons_print_typedefs(out, cont->tpdf, cont->tpdf_size, NULL);

    jsons_print_groupings(out, cont->child, NULL);
    jsons_print_data(out, cont->module, cont->child, NULL);
    jsons_print_actions(out, cont->child, NULL);
    jsons_print_notifs(out, cont->child, NULL);
    ly_print(out, "}");
}